

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

int bf_hex_dump(bfile_t *bfile,FILE *file,uint n_bytes,uint unit_size)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ushort **ppuVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  char line [256];
  char ascii [256];
  char format [256];
  char buffer [256];
  
  uVar1 = (ulong)n_bytes;
  line[0] = '\0';
  uVar7 = bfile->size - bfile->pos;
  uVar4 = uVar1;
  if (uVar7 < uVar1) {
    uVar4 = uVar7;
  }
  uVar8 = 0;
  while (uVar8 < uVar4) {
    uVar12 = 0;
    sprintf(line,"0x%06x:  ",(ulong)(uint)bfile->pos);
    while( true ) {
      if ((0xe < (uint)uVar12) || (uVar4 <= uVar8 + uVar12)) break;
      uVar11 = 0;
      uVar13 = 0;
      uVar9 = 0;
      for (; (uVar11 != 6 && (uVar8 + uVar12 < uVar4)); uVar12 = (ulong)((int)uVar12 + 1)) {
        bVar2 = bf_get_uint8(bfile);
        ppuVar5 = __ctype_b_loc();
        bVar3 = 0x2e;
        if (((*ppuVar5)[bVar2] >> 0xe & 1) != 0) {
          bVar3 = bVar2;
        }
        uVar9 = uVar9 << 8 | 0xff;
        uVar13 = uVar13 << 8 | (uint)bVar2;
        ascii[uVar12] = bVar3;
        uVar11 = uVar11 + 2;
      }
      sprintf(format,"%%0%dx ",(ulong)uVar11);
      sprintf(buffer,format,(ulong)(uVar9 & uVar13));
      strcat(line,buffer);
    }
    if ((uint)uVar12 < 0xf) {
      for (uVar10 = 0; uVar10 < (ulong)((byte)(0x12U - (char)uVar12) / 3) + uVar12 * -2 + 0x1d;
          uVar10 = (ulong)((int)uVar10 + 1)) {
        sVar6 = strlen(line);
        (line + sVar6)[0] = ' ';
        (line + sVar6)[1] = '\0';
      }
    }
    ascii[uVar12] = '\0';
    sVar6 = strlen(line);
    line[sVar6 + 2] = '\0';
    (line + sVar6)[0] = ' ';
    (line + sVar6)[1] = '\"';
    strcat(line,ascii);
    sVar6 = strlen(line);
    (line + sVar6)[0] = '\"';
    (line + sVar6)[1] = '\0';
    fprintf((FILE *)file,"%s\n",line);
    uVar8 = uVar8 + uVar12;
  }
  if (uVar7 < uVar1) {
    fprintf((FILE *)file,"0x%06x:  [reached end of file]\n",(ulong)(uint)bfile->pos);
  }
  return (int)uVar4;
}

Assistant:

int
bf_hex_dump(
    bfile_t * bfile,
    FILE * file,
    unsigned int n_bytes,
    unsigned int unit_size )
{
    char line[ 256 ];
    char ascii[ 256 ];
    char buffer[ 256 ];
    char format[ 256 ];
    bool_t eof;

    unsigned int i, j;
    size_t bytes, bytes_per_line, num_bytes = n_bytes;

    unit_size = 3;

    line[0] = '\0';
    eof = FALSE;

    if ( bf_get_remaining_length( bfile ) < num_bytes ) {
        num_bytes = bf_get_remaining_length( bfile );
        eof = TRUE;
    }

    bytes_per_line = 16;
    bytes_per_line -= (bytes_per_line%unit_size);

    bytes = 0;
    while ( bytes < num_bytes ) {
        sprintf( line, "0x%06x:  ", (unsigned int)bf_get_position( bfile ) );
        i = 0;
        while ( (i < bytes_per_line) && ((bytes + i) < num_bytes) ) {
            uint32_t word;
            uint32_t mask;
            word = 0; mask = 0;
            for ( j = 0; j < unit_size && (bytes + i) < num_bytes; j++ ) {
                word <<= 8;
                mask <<= 8; mask += 0xff;
                word += bf_get_uint8( bfile );
                ascii[i] = '.';
                if ( isprint( word & 0xff ) )
                    ascii[i] = word & 0xff;
                i++;
            }
            sprintf( format, "%%0%dx ", j * 2 );
            sprintf( buffer, format, (word & mask) );
            strcat( line, buffer );
        }
        if ( i < bytes_per_line ) {
            size_t pad;
            pad = ((bytes_per_line - i + unit_size) / unit_size) - 1 +
                  2 * (bytes_per_line - i);
            for ( j = 0; j < pad; j++ ) 
                strcat( line, " " );
        }
        ascii[i] = '\0';
        strcat( line, " \"" );
        strcat( line, ascii );
        strcat( line, "\"" );
        fprintf( file, "%s\n", line );
        bytes += i;
    }
    if ( eof != FALSE )
        fprintf( file, "0x%06x:  [reached end of file]\n",
            (unsigned int)bf_get_position( bfile ) );
    
    return (int)num_bytes;
}